

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessAnnounce
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  ErrorCode EVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint8_t count;
  uint16_t period;
  uint32_t channelMask;
  CommissionerAppPtr commissioner;
  byte local_1e3;
  ushort local_1e2;
  string *local_1e0;
  uint local_1d4;
  ErrorCode local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [16];
  CommissionerAppPtr local_188;
  ErrorCode local_178;
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  string local_150;
  ErrorCode local_130 [2];
  long local_128;
  long local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  Error local_108;
  Error local_e0;
  Error local_b8;
  Error local_90;
  format_string_checker<char> local_68;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_1e0 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  this_00 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x81) {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "too few arguments"
    ;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    begin = "too few arguments";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_68);
      }
      begin = pcVar2;
    } while (pcVar2 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_150,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_178 = kInvalidArgs;
    local_170 = local_160;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    local_1d0 = local_178;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c8,local_170,local_170 + local_168);
    local_1a0 = 0;
    local_198[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_1d0;
    local_1a8 = local_198;
    std::__cxx11::string::operator=(local_1e0,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    if (local_170 != local_160) {
      operator_delete(local_170);
    }
    paVar3 = &local_150.field_2;
  }
  else {
    JobManager::GetSelectedCommissioner
              (&local_90,
               (this->mJobManager).
               super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_188);
    local_1d0 = local_90.mCode;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_90.mMessage._M_dataplus._M_p,
               local_90.mMessage._M_dataplus._M_p + local_90.mMessage._M_string_length);
    local_1a0 = 0;
    local_198[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_1d0;
    local_1a8 = local_198;
    std::__cxx11::string::operator=(local_1e0,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mMessage._M_dataplus._M_p != &local_90.mMessage.field_2) {
      operator_delete(local_90.mMessage._M_dataplus._M_p);
    }
    if (EVar1 != kNone) goto LAB_001c0a43;
    utils::ParseInteger<unsigned_int>
              (&local_b8,&local_1d4,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1);
    local_1d0 = local_b8.mCode;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_b8.mMessage._M_dataplus._M_p,
               local_b8.mMessage._M_dataplus._M_p + local_b8.mMessage._M_string_length);
    local_1a0 = 0;
    local_198[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_1d0;
    local_1a8 = local_198;
    std::__cxx11::string::operator=(local_1e0,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.mMessage._M_dataplus._M_p != &local_b8.mMessage.field_2) {
      operator_delete(local_b8.mMessage._M_dataplus._M_p);
    }
    if (EVar1 != kNone) goto LAB_001c0a43;
    utils::ParseInteger<unsigned_char>
              (&local_e0,&local_1e3,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2);
    local_1d0 = local_e0.mCode;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_e0.mMessage._M_dataplus._M_p,
               local_e0.mMessage._M_dataplus._M_p + local_e0.mMessage._M_string_length);
    local_1a0 = 0;
    local_198[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_1d0;
    local_1a8 = local_198;
    std::__cxx11::string::operator=(local_1e0,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.mMessage._M_dataplus._M_p != &local_e0.mMessage.field_2) {
      operator_delete(local_e0.mMessage._M_dataplus._M_p);
    }
    if (EVar1 != kNone) goto LAB_001c0a43;
    utils::ParseInteger<unsigned_short>
              (&local_108,&local_1e2,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3);
    local_1d0 = local_108.mCode;
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,local_108.mMessage._M_dataplus._M_p,
               local_108.mMessage._M_dataplus._M_p + local_108.mMessage._M_string_length);
    local_1a0 = 0;
    local_198[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_1d0;
    local_1a8 = local_198;
    std::__cxx11::string::operator=(local_1e0,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.mMessage._M_dataplus._M_p != &local_108.mMessage.field_2) {
      operator_delete(local_108.mMessage._M_dataplus._M_p);
    }
    if (EVar1 != kNone) goto LAB_001c0a43;
    (*((local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x45])
              (local_130,
               local_188.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(ulong)local_1d4,(ulong)local_1e3,(ulong)local_1e2,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 4);
    local_1d0 = local_130[0];
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>((string *)local_1c8,local_128,local_120 + local_128);
    local_1a0 = 0;
    local_198[0] = 0;
    (__return_storage_ptr__->mError).mCode = local_1d0;
    local_1a8 = local_198;
    std::__cxx11::string::operator=(local_1e0,(string *)local_1c8);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1a8);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    paVar3 = &local_118;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
LAB_001c0a43:
  if (local_188.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessAnnounce(const Expression &aExpr)
{
    uint32_t           channelMask;
    uint8_t            count;
    uint16_t           period;
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 5, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    SuccessOrExit(value = ParseInteger(channelMask, aExpr[1]));
    SuccessOrExit(value = ParseInteger(count, aExpr[2]));
    SuccessOrExit(value = ParseInteger(period, aExpr[3]));
    SuccessOrExit(value =
                      commissioner->AnnounceBegin(channelMask, count, CommissionerApp::MilliSeconds(period), aExpr[4]));
exit:
    return value;
}